

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.hpp
# Opt level: O2

void __thiscall
VulkanUtilities::VulkanCommandBuffer::SetViewports
          (VulkanCommandBuffer *this,uint32_t FirstViewport,uint32_t ViewportCount,
          VkViewport *pViewports)

{
  VkCommandBuffer pVVar1;
  string msg;
  string local_48;
  
  pVVar1 = this->m_VkCmdBuffer;
  if (pVVar1 == (VkCommandBuffer)0x0) {
    Diligent::FormatString<char[26],char[32]>
              (&local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",(char (*) [32])pViewports);
    Diligent::DebugAssertionFailed
              (local_48._M_dataplus._M_p,"SetViewports",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x1b7);
    std::__cxx11::string::~string((string *)&local_48);
    pVVar1 = this->m_VkCmdBuffer;
  }
  (*vkCmdSetViewport)(pVVar1,FirstViewport,ViewportCount,pViewports);
  return;
}

Assistant:

__forceinline void SetViewports(uint32_t FirstViewport, uint32_t ViewportCount, const VkViewport* pViewports)
    {
        VERIFY_EXPR(m_VkCmdBuffer != VK_NULL_HANDLE);
        vkCmdSetViewport(m_VkCmdBuffer, FirstViewport, ViewportCount, pViewports);
    }